

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int unres_data_diff_new(unres_data *unres,lyd_node *subtree,lyd_node *parent,int created)

{
  int iVar1;
  lyd_node *second;
  lys_module *plVar2;
  LYD_DIFFTYPE type;
  uint index;
  lyd_difflist *diff;
  lyd_node *first;
  
  if (created == 0) {
    if (parent == (lyd_node *)0x0) {
      second = (lyd_node *)0x0;
    }
    else {
      second = (lyd_node *)lyd_path(parent);
      if (second == (lyd_node *)0x0) {
        plVar2 = lyd_node_module(subtree);
        ly_log(plVar2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","unres_data_diff_new"
              );
        return -1;
      }
    }
    diff = unres->diff;
    index = unres->diff_idx;
    unres->diff_idx = index + 1;
    type = LYD_DIFF_DELETED;
    first = subtree;
  }
  else {
    diff = unres->diff;
    index = unres->diff_idx;
    unres->diff_idx = index + 1;
    type = LYD_DIFF_CREATED;
    first = (lyd_node *)0x0;
    second = subtree;
  }
  iVar1 = lyd_difflist_add(diff,&unres->diff_size,index,type,first,second);
  return iVar1;
}

Assistant:

int
unres_data_diff_new(struct unres_data *unres, struct lyd_node *subtree, struct lyd_node *parent, int created)
{
    char *parent_xpath = NULL;

    if (created) {
        return lyd_difflist_add(unres->diff, &unres->diff_size, unres->diff_idx++, LYD_DIFF_CREATED, NULL, subtree);
    } else {
        if (parent) {
            parent_xpath = lyd_path(parent);
            LY_CHECK_ERR_RETURN(!parent_xpath, LOGMEM(lyd_node_module(subtree)->ctx), -1);
        }
        return lyd_difflist_add(unres->diff, &unres->diff_size, unres->diff_idx++, LYD_DIFF_DELETED,
                                subtree, (struct lyd_node *)parent_xpath);
    }
}